

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3.h
# Opt level: O0

void __thiscall mnf::SO3<mnf::ExpMapQuaternion>::SO3(SO3<mnf::ExpMapQuaternion> *this)

{
  string *this_00;
  Scalar local_a0;
  ConstantReturnType local_98;
  ConstRefVec local_88;
  Scalar local_60;
  ConstantReturnType local_58;
  ConstRefVec local_48;
  SO3<mnf::ExpMapQuaternion> *local_10;
  SO3<mnf::ExpMapQuaternion> *this_local;
  
  local_10 = this;
  mnf::Manifold::Manifold(&this->super_Manifold,3,3,4);
  *(undefined ***)this = &PTR__SO3_0013bbc8;
  mnf::ReusableTemporaryMap::ReusableTemporaryMap(&this->bufferMap_,0x100);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->typicalMagnitude_);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->trustMagnitude_);
  this_00 = (string *)mnf::Manifold::name_abi_cxx11_();
  std::__cxx11::string::operator=(this_00,"SO3");
  local_60 = 3.141592653589793;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Constant(&local_58,&local_60);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_48,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_58,(type *)0x0);
  setTypicalMagnitude(this,&local_48);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_48);
  local_a0 = 3.141592653589793;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Constant(&local_98,&local_a0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_88,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_98,(type *)0x0);
  setTrustMagnitude(this,&local_88);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_88);
  return;
}

Assistant:

inline SO3<Map>::SO3()
    : Manifold(3, Map::InputDim_, Map::OutputDim_)
{
  name() = "SO3";
  setTypicalMagnitude(Eigen::Vector3d::Constant(M_PI));
  setTrustMagnitude(Eigen::Vector3d::Constant(M_PI));
}